

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhConsumeCellkey(lhcell *pCell,_func_int_void_ptr_uint_void_ptr *xConsumer,void *pUserData,
                    int offt_only)

{
  lhash_kv_engine *plVar1;
  uchar *puVar2;
  unqlite_page *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uchar *buf;
  bool bVar8;
  unqlite_page *pOvfl;
  int local_54;
  void *local_50;
  pgno iOvfl;
  pgno *local_40;
  lhcell *local_38;
  
  iOvfl = pCell->iOvfl;
  local_54 = offt_only;
  if (iOvfl == 0) {
    iVar6 = (*xConsumer)(pCell->pPage->pRaw->zData + (ulong)pCell->iStart + 0x1a,pCell->nKey,
                         pUserData);
    iVar5 = -10;
    if (iVar6 == 0) {
      iVar5 = 0;
    }
    return iVar5;
  }
  plVar1 = pCell->pPage->pHash;
  uVar7 = pCell->nKey;
  uVar4 = plVar1->iPageSize - 8;
  local_40 = &pCell->iDataPage;
  bVar8 = true;
  local_50 = pUserData;
  local_38 = pCell;
  while( true ) {
    if (iOvfl == 0) {
      return 0;
    }
    if (uVar7 == 0) {
      return 0;
    }
    iVar5 = (*plVar1->pIo->xGet)(plVar1->pIo->pHandle,iOvfl,&pOvfl);
    puVar3 = pOvfl;
    if (iVar5 != 0) {
      return iVar5;
    }
    puVar2 = pOvfl->zData;
    buf = puVar2 + 8;
    if (bVar8) {
      SyBigEndianUnpack64(buf,local_40);
      local_38->iDataOfft = *(ushort *)(puVar2 + 0x10) << 8 | *(ushort *)(puVar2 + 0x10) >> 8;
      if (local_54 != 0) {
        (*plVar1->pIo->xPageUnref)(puVar3);
        return 0;
      }
      buf = puVar2 + 0x12;
    }
    if (uVar7 < uVar4 || uVar7 - uVar4 == 0) {
      iVar5 = (*xConsumer)(buf,uVar7,local_50);
      uVar7 = 0;
    }
    else {
      iVar5 = (*xConsumer)(buf,uVar4,local_50);
      uVar7 = uVar7 - uVar4;
    }
    puVar3 = pOvfl;
    if (iVar5 != 0) break;
    SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
    (*plVar1->pIo->xPageUnref)(puVar3);
    bVar8 = false;
  }
  (*plVar1->pIo->xPageUnref)(pOvfl);
  return -10;
}

Assistant:

static int lhConsumeCellkey(
	lhcell *pCell, /* Target cell */
	int (*xConsumer)(const void *,unsigned int,void *), /* Consumer callback */
	void *pUserData, /* Last argument to xConsumer() */
	int offt_only
	)
{
	lhpage *pPage = pCell->pPage;
	const unsigned char *zRaw = pPage->pRaw->zData;
	const unsigned char *zPayload;
	int rc;
	/* Point to the payload area */
	zPayload = &zRaw[pCell->iStart];
	if( pCell->iOvfl == 0 ){
		/* Best scenario, consume the key directly without any overflow page */
		zPayload += L_HASH_CELL_SZ;
		rc = xConsumer((const void *)zPayload,pCell->nKey,pUserData);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT;
		}
	}else{
		lhash_kv_engine *pEngine = pPage->pHash;
		sxu32 nByte,nData = pCell->nKey;
		unqlite_page *pOvfl;
		int data_offset = 0;
		pgno iOvfl;
		/* Overflow page */
		iOvfl = pCell->iOvfl;
		/* Total usable bytes in an overflow page */
		nByte = L_HASH_OVERFLOW_SIZE(pEngine->iPageSize);
		for(;;){
			if( iOvfl == 0 || nData < 1 ){
				/* no more overflow page */
				break;
			}
			/* Point to the overflow page */
			rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iOvfl,&pOvfl);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			zPayload = &pOvfl->zData[8];
			/* Point to the raw content */
			if( !data_offset ){
				/* Get the data page and offset */
				SyBigEndianUnpack64(zPayload,&pCell->iDataPage);
				zPayload += 8;
				SyBigEndianUnpack16(zPayload,&pCell->iDataOfft);
				zPayload += 2;
				if( offt_only ){
					/* Key too large, grab the data offset and return */
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_OK;
				}
				data_offset = 1;
			}
			/* Consume the key */
			if( nData <= nByte ){
				rc = xConsumer((const void *)zPayload,nData,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData = 0;
			}else{
				rc = xConsumer((const void *)zPayload,nByte,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData -= nByte;
			}
			/* Next overflow page in the chain */
			SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
			/* Unref the page */
			pEngine->pIo->xPageUnref(pOvfl);
		}
		rc = UNQLITE_OK;
	}
	return rc;
}